

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall
helics::CallbackFederate::CallbackFederate
          (CallbackFederate *this,string_view fedName,shared_ptr<helics::Core> *core,
          FederateInfo *fedInfo)

{
  string_view fedName_00;
  string_view fedName_01;
  char *in_RDX;
  size_t in_RSI;
  shared_ptr<helics::Core> *in_RDI;
  FederateInfo *in_stack_00000010;
  shared_ptr<helics::Core> *in_stack_00000018;
  Federate *in_stack_00000020;
  size_t in_stack_00000028;
  CallbackFederate *in_stack_00000030;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *this_00;
  FederateInfo *in_stack_ffffffffffffff98;
  void **in_stack_ffffffffffffffa8;
  CombinationFederate *in_stack_ffffffffffffffb0;
  
  fedName_00._M_str = (char *)in_stack_00000030;
  fedName_00._M_len = in_stack_00000028;
  Federate::Federate(in_stack_00000020,fedName_00,in_stack_00000018,in_stack_00000010);
  fedName_01._M_str = in_RDX;
  fedName_01._M_len = in_RSI;
  helics::CombinationFederate::CombinationFederate
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,fedName_01,in_RDI,
             in_stack_ffffffffffffff98);
  (in_RDI->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0xa46698;
  in_RDI[9].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vtable + 0x140);
  in_RDI[1].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0xa466f8;
  this_00 = (function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
             *)(in_RDI + 2);
  std::shared_ptr<helics::CallbackFederateOperator>::shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)0x3bd5e9);
  *(undefined1 *)&in_RDI[3].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)this_00);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function(this_00);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)this_00);
  loadOperator(in_stack_00000030);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(std::string_view fedName,
                                   const std::shared_ptr<Core>& core,
                                   const FederateInfo& fedInfo):
    Federate(fedName, core, fedInfo), CombinationFederate(fedName, core, fedInfo)
{
    loadOperator();
}